

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O1

auto_ptr<cmCompiledGeneratorExpression> __thiscall
cmGeneratorExpression::Parse(cmGeneratorExpression *this,char *input)

{
  _Alloc_hider _Var1;
  size_t sVar2;
  char *in_RDX;
  char *__s;
  _Alloc_hider local_50;
  undefined8 *local_48 [2];
  undefined8 local_38 [2];
  
  __s = "";
  if (in_RDX != (char *)0x0) {
    __s = in_RDX;
  }
  local_48[0] = local_38;
  sVar2 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,__s,__s + sVar2);
  Parse((cmGeneratorExpression *)&local_50,(string *)input);
  _Var1._M_p = local_50._M_p;
  local_50._M_p = (pointer)0x0;
  (this->Backtrace).Context.Name._M_dataplus._M_p = _Var1._M_p;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_50);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return (auto_ptr<cmCompiledGeneratorExpression>)(cmCompiledGeneratorExpression *)this;
}

Assistant:

cmsys::auto_ptr<cmCompiledGeneratorExpression>
cmGeneratorExpression::Parse(const char* input)
{
  return this->Parse(std::string(input ? input : ""));
}